

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode.c
# Opt level: O1

int m_id(aec_stream_conflict *strm)

{
  uint uVar1;
  internal_state_conflict *piVar2;
  byte *pbVar3;
  uint uVar4;
  int iVar5;
  size_t sVar6;
  int iVar7;
  ulong uVar8;
  
  piVar2 = strm->state;
  iVar7 = 0;
  if (piVar2->rsip == piVar2->rsi_buffer) {
    if ((strm->flags & 0x20) != 0) {
      uVar1 = piVar2->bitp;
      uVar4 = uVar1 + 7;
      if (-1 < (int)uVar1) {
        uVar4 = uVar1;
      }
      piVar2->bitp = uVar4 & 0xfffffff8;
    }
    iVar7 = 1;
    if (piVar2->pp == 0) goto LAB_00103c4a;
  }
  piVar2->ref = iVar7;
LAB_00103c4a:
  iVar7 = piVar2->id_len;
  iVar5 = piVar2->bitp;
  if (iVar5 < iVar7) {
    sVar6 = strm->avail_in;
    do {
      sVar6 = sVar6 - 1;
      if (sVar6 == 0xffffffffffffffff) {
        return 0;
      }
      strm->avail_in = sVar6;
      uVar8 = piVar2->acc << 8;
      piVar2->acc = uVar8;
      pbVar3 = strm->next_in;
      strm->next_in = pbVar3 + 1;
      piVar2->acc = *pbVar3 | uVar8;
      iVar5 = iVar5 + 8;
      piVar2->bitp = iVar5;
    } while (iVar5 < iVar7);
  }
  iVar5 = piVar2->bitp - iVar7;
  iVar7 = (int)(((piVar2->acc >> ((byte)iVar5 & 0x3f)) << (-(char)iVar7 & 0x3fU)) >>
               (-(char)iVar7 & 0x3fU));
  piVar2->id = iVar7;
  piVar2->bitp = iVar5;
  piVar2->mode = piVar2->id_table[iVar7];
  return 1;
}

Assistant:

static int m_id(struct aec_stream *strm)
{
    struct internal_state *state = strm->state;

    if (state->rsip == state->rsi_buffer) {
        if(strm->flags & AEC_PAD_RSI)
            state->bitp -= state->bitp % 8;
        if (state->pp)
            state->ref = 1;
    } else {
        state->ref = 0;
    }
    if (bits_ask(strm, state->id_len) == 0)
        return M_EXIT;
    state->id = bits_get(strm, state->id_len);
    bits_drop(strm, state->id_len);
    state->mode = state->id_table[state->id];

    return M_CONTINUE;
}